

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

iterator __thiscall
fmt::v7::detail::
arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>::
operator()(arg_formatter_base<fmt::v7::detail::buffer_appender<char>,_char,_fmt::v7::detail::error_handler>
           *this,basic_string_view<char> value)

{
  format_specs *pfVar1;
  buffer_appender<char> bVar2;
  basic_format_specs<char> *in_R8;
  basic_string_view<char> s;
  
  s.data_ = (char *)value.size_;
  pfVar1 = this->specs_;
  if (pfVar1 == (format_specs *)0x0) {
    write(this,(int)value.data_,s.data_,0);
  }
  else {
    if ((pfVar1->type != '\0') && (pfVar1->type != 's')) {
      error_handler::on_error((error_handler *)this,"invalid type specifier");
    }
    s.size_ = (size_t)pfVar1;
    bVar2 = write<char,char,fmt::v7::detail::buffer_appender<char>>
                      ((detail *)
                       (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.
                       container,(buffer_appender<char>)value.data_,s,in_R8);
    (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container =
         (buffer<char> *)bVar2.super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
  }
  return (iterator)
         (back_insert_iterator<fmt::v7::detail::buffer<char>_>)
         (this->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container;
}

Assistant:

iterator operator()(basic_string_view<Char> value) {
    if (specs_) {
      check_string_type_spec(specs_->type, error_handler());
      write(value, *specs_);
    } else {
      write(value);
    }
    return out_;
  }